

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O1

void Assimp::FBX::anon_unknown_3::TokenizeError(string *message,size_t offset)

{
  runtime_error *this;
  string local_68;
  string local_48;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FBX-Tokenize","");
  Util::AddOffset(&local_48,&local_68,message,offset);
  std::runtime_error::runtime_error(this,(string *)&local_48);
  *(undefined ***)this = &PTR__runtime_error_008e3168;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void TokenizeError(const std::string& message, size_t offset)
{
    throw DeadlyImportError(Util::AddOffset("FBX-Tokenize",message,offset));
}